

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleNodes(OpenGEXImporter *this,DDLNode *node,aiScene *pScene)

{
  bool bVar1;
  TokenType TVar2;
  DllNodeList *__x;
  reference ppDVar3;
  char *tokenType_00;
  iterator iStack_48;
  TokenType tokenType;
  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
  local_40;
  iterator it;
  DllNodeList childs;
  aiScene *pScene_local;
  DDLNode *node_local;
  OpenGEXImporter *this_local;
  
  if (node != (DDLNode *)0x0) {
    __x = ODDLParser::DDLNode::getChildNodeList(node);
    std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::vector
              ((vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_> *)&it,__x);
    local_40._M_current =
         (DDLNode **)
         std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::begin
                   ((vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_> *)&it);
    while( true ) {
      iStack_48 = std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::end
                            ((vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>
                              *)&it);
      bVar1 = __gnu_cxx::operator!=(&local_40,&stack0xffffffffffffffb8);
      if (!bVar1) break;
      ppDVar3 = __gnu_cxx::
                __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                ::operator*(&local_40);
      ODDLParser::DDLNode::getType_abi_cxx11_(*ppDVar3);
      tokenType_00 = (char *)std::__cxx11::string::c_str();
      TVar2 = Grammar::matchTokenType(tokenType_00);
      switch(TVar2) {
      case MetricToken:
        ppDVar3 = __gnu_cxx::
                  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                  ::operator*(&local_40);
        handleMetricNode(this,*ppDVar3,pScene);
        break;
      case NameToken:
        ppDVar3 = __gnu_cxx::
                  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                  ::operator*(&local_40);
        handleNameNode(this,*ppDVar3,pScene);
        break;
      case ObjectRefToken:
        ppDVar3 = __gnu_cxx::
                  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                  ::operator*(&local_40);
        handleObjectRefNode(this,*ppDVar3,pScene);
        break;
      case MaterialRefToken:
        ppDVar3 = __gnu_cxx::
                  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                  ::operator*(&local_40);
        handleMaterialRefNode(this,*ppDVar3,pScene);
        break;
      case MetricKeyToken:
        break;
      case GeometryNodeToken:
        ppDVar3 = __gnu_cxx::
                  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                  ::operator*(&local_40);
        handleGeometryNode(this,*ppDVar3,pScene);
        break;
      case CameraNodeToken:
        ppDVar3 = __gnu_cxx::
                  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                  ::operator*(&local_40);
        handleCameraNode(this,*ppDVar3,pScene);
        break;
      case LightNodeToken:
        ppDVar3 = __gnu_cxx::
                  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                  ::operator*(&local_40);
        handleLightNode(this,*ppDVar3,pScene);
        break;
      case GeometryObjectToken:
        ppDVar3 = __gnu_cxx::
                  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                  ::operator*(&local_40);
        handleGeometryObject(this,*ppDVar3,pScene);
        break;
      case CameraObjectToken:
        ppDVar3 = __gnu_cxx::
                  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                  ::operator*(&local_40);
        handleCameraObject(this,*ppDVar3,pScene);
        break;
      case LightObjectToken:
        ppDVar3 = __gnu_cxx::
                  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                  ::operator*(&local_40);
        handleLightObject(this,*ppDVar3,pScene);
        break;
      case TransformToken:
        ppDVar3 = __gnu_cxx::
                  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                  ::operator*(&local_40);
        handleTransformNode(this,*ppDVar3,pScene);
        break;
      case MeshToken:
        ppDVar3 = __gnu_cxx::
                  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                  ::operator*(&local_40);
        handleMeshNode(this,*ppDVar3,pScene);
        break;
      case VertexArrayToken:
        ppDVar3 = __gnu_cxx::
                  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                  ::operator*(&local_40);
        handleVertexArrayNode(this,*ppDVar3,pScene);
        break;
      case IndexArrayToken:
        ppDVar3 = __gnu_cxx::
                  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                  ::operator*(&local_40);
        handleIndexArrayNode(this,*ppDVar3,pScene);
        break;
      case MaterialToken:
        ppDVar3 = __gnu_cxx::
                  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                  ::operator*(&local_40);
        handleMaterialNode(this,*ppDVar3,pScene);
        break;
      case ColorToken:
        ppDVar3 = __gnu_cxx::
                  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                  ::operator*(&local_40);
        handleColorNode(this,*ppDVar3,pScene);
        break;
      case ParamToken:
        ppDVar3 = __gnu_cxx::
                  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                  ::operator*(&local_40);
        handleParamNode(this,*ppDVar3,pScene);
        break;
      case TextureToken:
        ppDVar3 = __gnu_cxx::
                  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                  ::operator*(&local_40);
        handleTextureNode(this,*ppDVar3,pScene);
      }
      __gnu_cxx::
      __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
      ::operator++(&local_40);
    }
    std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::~vector
              ((vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_> *)&it);
  }
  return;
}

Assistant:

void OpenGEXImporter::handleNodes( DDLNode *node, aiScene *pScene ) {
    if( nullptr == node ) {
        return;
    }

    DDLNode::DllNodeList childs = node->getChildNodeList();
    for( DDLNode::DllNodeList::iterator it = childs.begin(); it != childs.end(); ++it ) {
        Grammar::TokenType tokenType( Grammar::matchTokenType( ( *it )->getType().c_str() ) );
        switch( tokenType ) {
            case Grammar::MetricToken:
                handleMetricNode( *it, pScene );
                break;

            case Grammar::NameToken:
                handleNameNode( *it, pScene );
                break;

            case Grammar::ObjectRefToken:
                handleObjectRefNode( *it, pScene );
                break;

            case Grammar::MaterialRefToken:
                handleMaterialRefNode( *it, pScene );
                break;

            case Grammar::MetricKeyToken:
                break;

            case Grammar::GeometryNodeToken:
                handleGeometryNode( *it, pScene );
                break;

            case Grammar::CameraNodeToken:
                handleCameraNode( *it, pScene );
                break;

            case Grammar::LightNodeToken:
                handleLightNode( *it, pScene );
                break;

            case Grammar::GeometryObjectToken:
                handleGeometryObject( *it, pScene );
                break;

            case Grammar::CameraObjectToken:
                handleCameraObject( *it, pScene );
                break;

            case Grammar::LightObjectToken:
                handleLightObject( *it, pScene );
                break;

            case Grammar::TransformToken:
                handleTransformNode( *it, pScene );
                break;

            case Grammar::MeshToken:
                handleMeshNode( *it, pScene );
                break;

            case Grammar::VertexArrayToken:
                handleVertexArrayNode( *it, pScene );
                break;

            case Grammar::IndexArrayToken:
                handleIndexArrayNode( *it, pScene );
                break;

            case Grammar::MaterialToken:
                handleMaterialNode( *it, pScene );
                break;

            case Grammar::ColorToken:
                handleColorNode( *it, pScene );
                break;

            case Grammar::ParamToken:
                handleParamNode( *it, pScene );
                break;

            case Grammar::TextureToken:
                handleTextureNode( *it, pScene );
                break;

            default:
                break;
        }
    }
}